

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareVAO<double>
          (AttributeFormatTest *this,GLint size,GLenum type_gl_name,bool normalized,
          AtributeFormatFunctionType function_selector)

{
  ostringstream *this_00;
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  code *pcVar6;
  char *pcVar7;
  size_t sVar8;
  undefined4 *puVar9;
  char *pcVar10;
  Enum<int,_2UL> local_258;
  Enum<int,_2UL> local_248;
  undefined1 local_238 [120];
  ios_base local_1c0 [264];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x872);
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x875);
  local_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0x3ff00000;
  local_a8 = 0x4000000000000000;
  uStack_a0 = 0x4008000000000000;
  local_98 = 0x4010000000000000;
  uStack_90 = 0x4014000000000000;
  local_88 = 0x4018000000000000;
  uStack_80 = 0x401c000000000000;
  local_78 = 0x4020000000000000;
  uStack_70 = 0x4022000000000000;
  local_68 = 0x4024000000000000;
  uStack_60 = 0x4026000000000000;
  local_58 = 0x4028000000000000;
  uStack_50 = 0x402a000000000000;
  local_48 = 0;
  uStack_44 = 0x402c0000;
  uStack_40 = 0;
  uStack_3c = 0x402e0000;
  (**(code **)(lVar5 + 0x6c8))(1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x881);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_array);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x884);
  (**(code **)(lVar5 + 0x150))(0x8892,0x80,&local_b8,0x88e4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x887);
  pcVar6 = *(code **)(lVar5 + 0x1898);
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
  (*pcVar6)(uVar4,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88b);
  pcVar6 = *(code **)(lVar5 + 0x1898);
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
  (*pcVar6)(uVar4,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88e);
  if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
    pcVar6 = *(code **)(lVar5 + 0x16b0);
    GVar1 = this->m_vao;
    uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
    (*pcVar6)(GVar1,uVar4,size,type_gl_name,0);
    pcVar6 = *(code **)(lVar5 + 0x16b0);
  }
  else {
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
        puVar9 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar9 = 0;
        __cxa_throw(puVar9,&int::typeinfo,0);
      }
      pcVar6 = *(code **)(lVar5 + 0x16a8);
      GVar1 = this->m_vao;
      uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
      (*pcVar6)(GVar1,uVar4,size,type_gl_name,normalized,0);
      pcVar6 = *(code **)(lVar5 + 0x16a8);
      GVar1 = this->m_vao;
      uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
      (*pcVar6)(GVar1,uVar4,size,type_gl_name,normalized,0);
      goto LAB_00abf999;
    }
    pcVar6 = *(code **)(lVar5 + 0x16b8);
    GVar1 = this->m_vao;
    uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
    (*pcVar6)(GVar1,uVar4,size,type_gl_name,0);
    pcVar6 = *(code **)(lVar5 + 0x16b8);
  }
  GVar1 = this->m_vao;
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
  (*pcVar6)(GVar1,uVar4,size,type_gl_name,0);
LAB_00abf999:
  iVar2 = (**(code **)(lVar5 + 0x800))();
  if (iVar2 == 0) {
    (**(code **)(lVar5 + 0xe0))(0,this->m_bo_array,0,size << 4);
    (**(code **)(lVar5 + 0xe0))(1,this->m_bo_array,(long)size << 3,size << 4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8be);
    (**(code **)(lVar5 + 0x610))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c1);
    (**(code **)(lVar5 + 0x610))(1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c4);
    (**(code **)(lVar5 + 0xd8))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c7);
  }
  else {
    local_238._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_238 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar10 = "VertexArrayAttrib?Format";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
      pcVar10 = "VertexArrayAttribIFormat";
    }
    pcVar7 = "VertexArrayAttribLFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      pcVar7 = pcVar10;
    }
    pcVar10 = "VertexArrayAttribFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar10 = pcVar7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar10,
               (ulong)(function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) + 0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," has unexpectedly generated ",0x1c);
    local_248.m_getName = glu::getErrorName;
    local_248.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_248,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"error for test with size = ",0x1b);
    std::ostream::operator<<(this_00,size);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", type = ",9);
    local_258.m_getName = glu::getTypeName;
    local_258.m_value = type_gl_name;
    tcu::Format::Enum<int,_2UL>::toStream(&local_258,(ostream *)this_00);
    pcVar10 = ", which was not normalized.";
    if (normalized) {
      pcVar10 = ", which was normalized.";
    }
    pcVar7 = ".";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar7 = pcVar10;
    }
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Test fails.\n",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_1c0);
  }
  return iVar2 == 0;
}

Assistant:

bool AttributeFormatTest::PrepareVAO(glw::GLint size, glw::GLenum type_gl_name, bool normalized,
									 AtributeFormatFunctionType function_selector)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */

	const glw::GLdouble scale = normalized ? NormalizationScaleFactor<T>() : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	gl.genBuffers(1, &m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data), array_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* Attribute setup. */
	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	/* Tested attribute format setup. */
	switch (function_selector)
	{
	case ATTRIBUTE_FORMAT_FUNCTION_FLOAT:
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, normalized, 0);
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, normalized, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_DOUBLE:
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_INTEGER:
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;
	default:
		throw 0;
	}

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					"VertexArrayAttribFormat" :
					((ATTRIBUTE_FORMAT_FUNCTION_DOUBLE == function_selector) ?
						 "VertexArrayAttribLFormat" :
						 ((ATTRIBUTE_FORMAT_FUNCTION_INTEGER == function_selector) ? "VertexArrayAttribIFormat" :
																					 "VertexArrayAttrib?Format")))
			<< " has unexpectedly generated " << glu::getErrorStr(error) << "error for test with size = " << size
			<< ", type = " << glu::getTypeStr(type_gl_name)
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					(normalized ? ", which was normalized." : ", which was not normalized.") :
					".")
			<< " Test fails.\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.bindVertexBuffer(0, m_bo_array, 0, static_cast<glw::GLsizei>(sizeof(T) * size * 2));
	gl.bindVertexBuffer(1, m_bo_array, (glw::GLintptr)((T*)NULL + size),
						static_cast<glw::GLsizei>(sizeof(T) * size * 2));

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}